

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cxx
# Opt level: O2

uint32_t crc32_8_last8(void *data,size_t len,uint32_t prev_value)

{
  uint32_t uVar1;
  size_t len_00;
  
  len_00 = 8;
  if (len < 8) {
    len_00 = len;
  }
  uVar1 = crc32_8((void *)((long)data + (len - len_00)),len_00,prev_value);
  return uVar1;
}

Assistant:

uint32_t crc32_8_last8(const void* data, size_t len, uint32_t prev_value) {
    size_t min = MIN(len, 8);
    void *src = (char*)data + (len-min);
#ifdef _ALIGN_MEM_ACCESS
    uint64_t temp; // aligned
    memcpy(&temp, src, min);
    src = &temp;
#endif
    return crc32_8(src, min, prev_value);
}